

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall common_log::set_colors(common_log *this,bool colors)

{
  pointer ppcVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  
  pause(this);
  if ((int)CONCAT71(in_register_00000031,colors) == 0) {
    if (g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar2 = 0;
      do {
        g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar2] = "";
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)g_col.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)g_col.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    *g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_start = "\x1b[0m";
    ppcVar1 = g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    g_col.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] = "\x1b[1m";
    ppcVar1[2] = "\x1b[31m";
    ppcVar1[3] = "\x1b[32m";
    ppcVar1[4] = "\x1b[33m";
    ppcVar1[5] = "\x1b[34m";
    ppcVar1[6] = "\x1b[35m";
    ppcVar1[7] = "\x1b[36m";
    ppcVar1[8] = "\x1b[37m";
  }
  resume(this);
  return;
}

Assistant:

void set_colors(bool colors) {
        pause();

        if (colors) {
            g_col[COMMON_LOG_COL_DEFAULT] = LOG_COL_DEFAULT;
            g_col[COMMON_LOG_COL_BOLD]    = LOG_COL_BOLD;
            g_col[COMMON_LOG_COL_RED]     = LOG_COL_RED;
            g_col[COMMON_LOG_COL_GREEN]   = LOG_COL_GREEN;
            g_col[COMMON_LOG_COL_YELLOW]  = LOG_COL_YELLOW;
            g_col[COMMON_LOG_COL_BLUE]    = LOG_COL_BLUE;
            g_col[COMMON_LOG_COL_MAGENTA] = LOG_COL_MAGENTA;
            g_col[COMMON_LOG_COL_CYAN]    = LOG_COL_CYAN;
            g_col[COMMON_LOG_COL_WHITE]   = LOG_COL_WHITE;
        } else {
            for (size_t i = 0; i < g_col.size(); i++) {
                g_col[i] = "";
            }
        }

        resume();
    }